

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmXe_LPGCachePolicy.cpp
# Opt level: O0

uint32_t __thiscall
GmmLib::GmmXe_LPGCachePolicy::CachePolicyGetPATIndex
          (GmmXe_LPGCachePolicy *this,GMM_RESOURCE_INFO *pResInfo,GMM_RESOURCE_USAGE_TYPE Usage,
          bool *pCompressionEnable,bool IsCpuCacheable)

{
  GMM_CACHE_POLICY_ELEMENT local_b0;
  GMM_CACHE_POLICY_ELEMENT local_88;
  GMM_CACHE_POLICY_ELEMENT local_60;
  byte local_31;
  bool *pbStack_30;
  bool IsCpuCacheable_local;
  bool *pCompressionEnable_local;
  GMM_RESOURCE_INFO *pGStack_20;
  GMM_RESOURCE_USAGE_TYPE Usage_local;
  GMM_RESOURCE_INFO *pResInfo_local;
  GmmXe_LPGCachePolicy *this_local;
  
  local_31 = IsCpuCacheable;
  pbStack_30 = pCompressionEnable;
  pCompressionEnable_local._4_4_ = Usage;
  pGStack_20 = pResInfo;
  pResInfo_local = (GMM_RESOURCE_INFO *)this;
  if (pResInfo != (GMM_RESOURCE_INFO *)0x0) {
    (*(pResInfo->super_GmmResourceInfoCommon)._vptr_GmmResourceInfoCommon[0x23])();
  }
  if ((local_31 & 1) == 0) {
    Context::GetCachePolicyElement
              (&local_b0,
               (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy
               .super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
               pGmmLibContext,pCompressionEnable_local._4_4_);
    this_local._4_4_ = local_b0.field_3;
  }
  else {
    Context::GetCachePolicyElement
              (&local_60,
               (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy
               .super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
               pGmmLibContext,pCompressionEnable_local._4_4_);
    Context::GetCachePolicyElement
              (&local_88,
               (this->super_GmmGen12CachePolicy).super_GmmGen11CachePolicy.super_GmmGen10CachePolicy
               .super_GmmGen9CachePolicy.super_GmmGen8CachePolicy.super_GmmCachePolicyCommon.
               pGmmLibContext,pCompressionEnable_local._4_4_);
    this_local._4_4_ =
         (uint)((local_60.field_1.Value >> 0x29 & 1) << 5) |
         (uint)local_88.field_1.Value._4_4_ >> 4 & 0x1f;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t GMM_STDCALL GmmLib::GmmXe_LPGCachePolicy::CachePolicyGetPATIndex(GMM_RESOURCE_INFO *pResInfo, GMM_RESOURCE_USAGE_TYPE Usage, bool *pCompressionEnable, bool IsCpuCacheable)
{
    __GMM_ASSERT(pGmmLibContext->GetCachePolicyElement(Usage).Initialized);
    GMM_UNREFERENCED_PARAMETER(pCompressionEnable);

    // Prevent wrong Usage for XAdapter resources. UMD does not call GetMemoryObject on shader resources but,
    // when they add it someone could call it without knowing the restriction.
    if(pResInfo &&
       pResInfo->GetResFlags().Info.XAdapter &&
       Usage != GMM_RESOURCE_USAGE_XADAPTER_SHARED_RESOURCE)
    {
        __GMM_ASSERT(false);
    }

    if(IsCpuCacheable)
    {
        return (uint32_t)(GET_COHERENT_PATINDEX_VALUE(pGmmLibContext, Usage));
    }
    else
    {
        return pGmmLibContext->GetCachePolicyElement(Usage).PATIndex;
    }
}